

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc:258:56)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_java_file_cc:258:56)>_>
          *this,EnumDescriptor *descriptor)

{
  char *pcVar1;
  bool bVar2;
  MessageLite *pMVar3;
  Status status;
  AlphaNum local_78;
  AlphaNum local_48;
  
  pMVar3 = ExtensionSet::GetMessage
                     (&(descriptor->merged_features_->field_0)._impl_._extensions_,pb::java,
                      (MessageLite *)PTR__JavaFeatures_default_instance__01987248);
  if (*(char *)((long)&pMVar3[1]._internal_metadata_.ptr_ + 5) == '\x01') {
    bVar2 = EnumDescriptor::is_closed(descriptor);
    if (bVar2) {
      pcVar1 = (descriptor->all_names_).payload_;
      local_48.piece_._M_len = (size_t)*(ushort *)(pcVar1 + 2);
      local_48.piece_._M_str = pcVar1 + ~local_48.piece_._M_len;
      local_78.piece_._M_len = 0x9b;
      local_78.piece_._M_str =
           " is a closed enum and can not be used with the large_enum feature.  Please migrate to an open enum first, which is a better fit for extremely large enums.\n"
      ;
      absl::lts_20250127::StrAppend
                (*(this->visitor).super_anon_class_8_1_a7dec128.error,&local_48,&local_78);
    }
  }
  compiler::java::ValidateNestInFileClassFeature((java *)&local_78,descriptor);
  if ((StatusRep *)local_78.piece_._M_len != (StatusRep *)0x1) {
    if ((local_78.piece_._M_len & 1) == 0) {
      local_48.piece_._M_str = (((string *)(local_78.piece_._M_len + 8))->_M_dataplus)._M_p;
      local_48.piece_._M_len = ((string *)(local_78.piece_._M_len + 8))->_M_string_length;
    }
    else {
      local_48.piece_._M_len =
           (size_t)((uint)((long)(local_78.piece_._M_len << 0x3e) >> 0x3f) & 0x1b);
      local_48.piece_._M_str = (char *)((long)(local_78.piece_._M_len << 0x3e) >> 0x3f & 0x10e15d0);
    }
    absl::lts_20250127::StrAppend(*(this->visitor).super_anon_class_8_1_a7dec128.error,&local_48);
    if ((local_78.piece_._M_len & 1) == 0) {
      absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_78.piece_._M_len);
    }
  }
  return;
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }